

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

value_type * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[2]>
          (value_type *__return_storage_ptr__,void *this,char (*v) [2])

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  uint *local_80;
  long local_78;
  uint local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  long *local_60;
  long local_58;
  long local_50 [2];
  uint *local_40;
  long local_38;
  undefined8 local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  cVar1 = *this;
  if (cVar1 == '\x01') {
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,*(long *)((long)this + 8),
               *(long *)((long)this + 0x10) + *(long *)((long)this + 8));
  }
  else {
    local_80 = &local_70;
    sVar2 = strlen(*v);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,v,*v + sVar2);
    lVar3 = local_78;
    if (local_80 == &local_70) {
      uStack_28 = uStack_68;
      uStack_24 = uStack_64;
      local_80 = (uint *)&local_30;
    }
    local_30 = CONCAT44(uStack_6c,local_70);
    local_38 = local_78;
    local_78 = 0;
    local_70 = local_70 & 0xffffff00;
    local_60 = local_50;
    lVar3 = lVar3 + (long)local_80;
    local_40 = local_80;
    local_80 = &local_70;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,lVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_60,local_58 + (long)local_60);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (cVar1 == '\0') {
    if (local_40 != (uint *)&local_30) {
      operator_delete(local_40,local_30 + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT44(uStack_6c,local_70) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr value_type value_or( U && v ) const optional_ref_qual
    {
        return has_value() ? contained.value() : static_cast<T>(std::forward<U>( v ) );
    }